

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canvas.cpp
# Opt level: O2

int main(void)

{
  undefined1 auVar1 [16];
  Rect rct;
  Rect rct_00;
  Rect rct_01;
  long lVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  TerminalInfo *pTVar11;
  BrailleCanvas *pBVar12;
  ostream *poVar13;
  size_t sVar14;
  long lVar15;
  long lVar16;
  Size char_sz;
  Point p;
  Point p_00;
  Point p_01;
  Point p_02;
  Point p_03;
  Point p_04;
  Point p_05;
  Point p_06;
  initializer_list<plot::GenericPoint<long>_> __l;
  Point from;
  Point from_00;
  Point from_01;
  Point from_02;
  Point p_07;
  Point p_08;
  Point to;
  Point to_00;
  Point to_01;
  Point to_02;
  anon_class_1_0_00000001 local_1c9;
  size_t local_1c8;
  long local_1c0;
  long local_1b8;
  long local_1b0;
  vector<plot::GenericPoint<long>,_std::allocator<plot::GenericPoint<long>_>_> points;
  GenericRect<long> local_188;
  long local_160;
  size_t local_158;
  long local_150;
  long local_148;
  long local_140;
  long local_138;
  size_t local_130;
  anon_class_40_2_c97c9906 set;
  BrailleCanvas canvas;
  Rect strokeArea;
  
  set.rct.p1.x._0_4_ = 0;
  set.rct.p1.x._4_4_ = 0x3f666666;
  set.rct.p1.y._0_4_ = 0x3f666666;
  set.rct.p1.y._4_4_ = 0x3f666666;
  set.rct.p2.x._0_4_ = 0x3f800000;
  set.rct.p2.x._4_4_ = 0;
  set.rct.p2.y = 0;
  set.fn = (anon_class_1_0_00000001 *)0x13f800000;
  pTVar11 = plot::TerminalInfo::detect<void>((TerminalInfo *)&set);
  char_sz.y = 0x14;
  char_sz.x = 0x46;
  plot::BrailleCanvas::BrailleCanvas(&canvas,char_sz,*pTVar11);
  rct.p1.y = 0xb;
  rct.p1.x = 0xb;
  rct.p2.x = 0x28;
  rct.p2.y = 0x28;
  plot::BrailleCanvas::rect
            (&canvas,(Color *)plot::palette::firebrick,(Color *)plot::palette::blueviolet,rct,Over);
  pBVar12 = plot::BrailleCanvas::push(&canvas);
  from.y = 0x11;
  from.x = 0xc;
  to.y = 0x27;
  to.x = 0x11;
  pBVar12 = plot::BrailleCanvas::line(pBVar12,(Color *)plot::palette::limegreen,from,to,Over);
  from_00.y = 0x27;
  from_00.x = 0x11;
  to_00.y = 0x22;
  to_00.x = 0x27;
  pBVar12 = plot::BrailleCanvas::line(pBVar12,(Color *)plot::palette::limegreen,from_00,to_00,Over);
  from_01.y = 0x22;
  from_01.x = 0x27;
  to_01.y = 0xc;
  to_01.x = 0x22;
  pBVar12 = plot::BrailleCanvas::line(pBVar12,(Color *)plot::palette::limegreen,from_01,to_01,Over);
  from_02.y = 0xc;
  from_02.x = 0x22;
  to_02.y = 0x11;
  to_02.x = 0xc;
  plot::BrailleCanvas::line(pBVar12,(Color *)plot::palette::limegreen,from_02,to_02,Over);
  plot::BrailleCanvas::pop(&canvas,ClipDst);
  rct_00.p1.y = 0xb;
  rct_00.p1.x = 0x2d;
  rct_00.p2.x = 0x4b;
  rct_00.p2.y = 0x29;
  plot::BrailleCanvas::ellipse(&canvas,(Color *)plot::palette::slategrey,rct_00,Over);
  set.rct.p1.x._0_4_ = 0x3c;
  set.rct.p1.x._4_4_ = 0;
  set.rct.p1.y._0_4_ = 0x1a;
  set.rct.p1.y._4_4_ = 0;
  points.super__Vector_base<plot::GenericPoint<long>,_std::allocator<plot::GenericPoint<long>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0xa;
  points.super__Vector_base<plot::GenericPoint<long>,_std::allocator<plot::GenericPoint<long>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0xc;
  plot::BrailleCanvas::ellipse
            (&canvas,(Color *)plot::palette::green,(Color *)plot::palette::yellow,(Point *)&set,
             (Size *)&points,Over);
  strokeArea.p2.x = 0x47;
  strokeArea.p2.y = 0x47;
  strokeArea.p1.x = 0xc;
  strokeArea.p1.y = 0x2e;
  plot::BrailleCanvas::rect(&canvas,(Color *)plot::palette::lightcyan,&strokeArea,Over);
  plot::BrailleCanvas::push(&canvas);
  rct_01.p1.y = strokeArea.p1.y;
  rct_01.p1.x = strokeArea.p1.x;
  rct_01.p2.x = strokeArea.p2.x;
  rct_01.p2.y = strokeArea.p2.y;
  plot::BrailleCanvas::stroke<std::pair<long,long>(&)(long)>
            (&canvas,(Color *)plot::palette::royalblue,rct_01,sinStrokeFunction,Over);
  local_188.p1.x = strokeArea.p2.x;
  if (strokeArea.p1.x < strokeArea.p2.x) {
    local_188.p1.x = strokeArea.p1.x;
  }
  local_188.p2.x = strokeArea.p2.x;
  if (strokeArea.p2.x < strokeArea.p1.x) {
    local_188.p2.x = strokeArea.p1.x;
  }
  local_188.p1.y = strokeArea.p2.y;
  if (strokeArea.p1.y < strokeArea.p2.y) {
    local_188.p1.y = strokeArea.p1.y;
  }
  local_188.p2.y = strokeArea.p2.y;
  if (strokeArea.p2.y < strokeArea.p1.y) {
    local_188.p2.y = strokeArea.p1.y;
  }
  local_188.p2.x = local_188.p2.x + 1;
  local_188.p2.y = local_188.p2.y + 1;
  points.super__Vector_base<plot::GenericPoint<long>,_std::allocator<plot::GenericPoint<long>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(canvas.cols_ * 2);
  points.super__Vector_base<plot::GenericPoint<long>,_std::allocator<plot::GenericPoint<long>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  points.super__Vector_base<plot::GenericPoint<long>,_std::allocator<plot::GenericPoint<long>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  plot::GenericRect<long>::clamp(&set.rct,&local_188,(GenericRect<long> *)&points);
  local_188.p1.x = CONCAT44(set.rct.p1.x._4_4_,(undefined4)set.rct.p1.x);
  local_188.p1.y = CONCAT44(set.rct.p1.y._4_4_,(undefined4)set.rct.p1.y);
  local_188.p2.x = CONCAT44(set.rct.p2.x._4_4_,(undefined4)set.rct.p2.x);
  local_188.p2.y = set.rct.p2.y;
  local_158 = local_188.p1.x / 2;
  local_1c8 = local_188.p1.y / 4;
  local_140 = local_188.p2.x % 2 + local_188.p2.x / 2;
  if (local_140 < 2) {
    local_140 = 1;
  }
  local_150 = (set.rct.p2.y / 4 + 1) - (ulong)((set.rct.p2.y & 3U) == 0);
  if (local_150 < 2) {
    local_150 = 1;
  }
  set.fn = &local_1c9;
  local_160 = local_158 * 2;
  for (; (long)local_1c8 < local_150; local_1c8 = local_1c8 + 1) {
    local_148 = local_1c8 * 4;
    local_1b0 = local_1c8 * 4 + 1;
    local_1b8 = local_1c8 * 4 + 2;
    local_1c0 = local_1c8 * 4 + 3;
    lVar16 = local_160;
    for (sVar14 = local_158; lVar2 = local_148, (long)sVar14 < local_140; sVar14 = sVar14 + 1) {
      p.y = local_148;
      p.x = lVar16;
      bVar3 = plot::BrailleCanvas::
              fill<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fbbdev[P]plot/examples/canvas.cpp:115:46)>
              ::anon_class_40_2_c97c9906::operator()(&set,p);
      p_00.y = local_1b0;
      p_00.x = lVar16;
      bVar4 = plot::BrailleCanvas::
              fill<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fbbdev[P]plot/examples/canvas.cpp:115:46)>
              ::anon_class_40_2_c97c9906::operator()(&set,p_00);
      p_01.y = local_1b8;
      p_01.x = lVar16;
      local_130 = sVar14;
      bVar5 = plot::BrailleCanvas::
              fill<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fbbdev[P]plot/examples/canvas.cpp:115:46)>
              ::anon_class_40_2_c97c9906::operator()(&set,p_01);
      p_02.y = local_1c0;
      p_02.x = lVar16;
      bVar6 = plot::BrailleCanvas::
              fill<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fbbdev[P]plot/examples/canvas.cpp:115:46)>
              ::anon_class_40_2_c97c9906::operator()(&set,p_02);
      lVar15 = lVar16 + 1;
      p_03.y = lVar2;
      p_03.x = lVar15;
      local_138 = lVar16;
      bVar7 = plot::BrailleCanvas::
              fill<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fbbdev[P]plot/examples/canvas.cpp:115:46)>
              ::anon_class_40_2_c97c9906::operator()(&set,p_03);
      p_04.y = local_1b0;
      p_04.x = lVar15;
      bVar8 = plot::BrailleCanvas::
              fill<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fbbdev[P]plot/examples/canvas.cpp:115:46)>
              ::anon_class_40_2_c97c9906::operator()(&set,p_04);
      p_05.y = local_1b8;
      p_05.x = lVar15;
      bVar9 = plot::BrailleCanvas::
              fill<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fbbdev[P]plot/examples/canvas.cpp:115:46)>
              ::anon_class_40_2_c97c9906::operator()(&set,p_05);
      p_06.y = local_1c0;
      p_06.x = lVar15;
      bVar10 = plot::BrailleCanvas::
               fill<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fbbdev[P]plot/examples/canvas.cpp:115:46)>
               ::anon_class_40_2_c97c9906::operator()(&set,p_06);
      sVar14 = local_130;
      points.
      super__Vector_base<plot::GenericPoint<long>,_std::allocator<plot::GenericPoint<long>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x3f0083123f7ae148;
      points.
      super__Vector_base<plot::GenericPoint<long>,_std::allocator<plot::GenericPoint<long>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x3f8000003ee4dd2f;
      points.
      super__Vector_base<plot::GenericPoint<long>,_std::allocator<plot::GenericPoint<long>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)CONCAT71(points.
                             super__Vector_base<plot::GenericPoint<long>,_std::allocator<plot::GenericPoint<long>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                             bVar10 << 7 | bVar9 << 5 |
                             bVar8 << 4 |
                             bVar7 << 3 | bVar6 << 6 | bVar5 << 2 | bVar4 * '\x02' + bVar3);
      plot::BrailleCanvas::paint(&canvas,local_1c8,local_130,(block_t *)&points,ClipSrc);
      lVar16 = local_138 + 2;
    }
  }
  plot::BrailleCanvas::pop(&canvas,Over);
  plot::BrailleCanvas::dot(&canvas,(Color *)plot::palette::orange,(Point)ZEXT816(0),Over);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = canvas.lines_ * 4 - 1;
  plot::BrailleCanvas::dot(&canvas,(Color *)plot::palette::purple,(Point)(auVar1 << 0x40),Over);
  p_07.y = 0;
  p_07.x = canvas.cols_ * 2 - 1;
  plot::BrailleCanvas::dot(&canvas,(Color *)plot::palette::gold,p_07,Over);
  p_08.y = canvas.lines_ * 4 + -1;
  p_08.x = canvas.cols_ * 2 + -1;
  plot::BrailleCanvas::dot(&canvas,(Color *)plot::palette::indigo,p_08,Over);
  set.fn = (anon_class_1_0_00000001 *)0x64;
  set.rct.p2.x._0_4_ = 0x50;
  set.rct.p2.x._4_4_ = 0;
  set.rct.p2.y = 0xc;
  set.rct.p1.x._0_4_ = 0x62;
  set.rct.p1.x._4_4_ = 0;
  set.rct.p1.y._0_4_ = 0x1e;
  set.rct.p1.y._4_4_ = 0;
  points.super__Vector_base<plot::GenericPoint<long>,_std::allocator<plot::GenericPoint<long>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)&set;
  points.super__Vector_base<plot::GenericPoint<long>,_std::allocator<plot::GenericPoint<long>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x4;
  plot::BrailleCanvas::path
            (&canvas,(Color *)plot::palette::deepskyblue,
             (initializer_list<plot::GenericPoint<long>_> *)&points,Over);
  set.fn = (anon_class_1_0_00000001 *)0x64;
  set.rct.p2.x._0_4_ = 0x50;
  set.rct.p2.x._4_4_ = 0;
  set.rct.p2.y = 0x44;
  set.rct.p1.x._0_4_ = 0x62;
  set.rct.p1.x._4_4_ = 0;
  set.rct.p1.y._0_4_ = 0x32;
  set.rct.p1.y._4_4_ = 0;
  __l._M_len = 4;
  __l._M_array = (iterator)&set;
  std::vector<plot::GenericPoint<long>,_std::allocator<plot::GenericPoint<long>_>_>::vector
            (&points,__l,(allocator_type *)&local_188);
  plot::BrailleCanvas::
  path<__gnu_cxx::__normal_iterator<plot::GenericPoint<long>*,std::vector<plot::GenericPoint<long>,std::allocator<plot::GenericPoint<long>>>>>
            (&canvas,(Color *)plot::palette::mediumseagreen,
             (__normal_iterator<plot::GenericPoint<long>_*,_std::vector<plot::GenericPoint<long>,_std::allocator<plot::GenericPoint<long>_>_>_>
              )points.
               super__Vector_base<plot::GenericPoint<long>,_std::allocator<plot::GenericPoint<long>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<plot::GenericPoint<long>_*,_std::vector<plot::GenericPoint<long>,_std::allocator<plot::GenericPoint<long>_>_>_>
              )points.
               super__Vector_base<plot::GenericPoint<long>,_std::allocator<plot::GenericPoint<long>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,Over);
  poVar13 = plot::operator<<((ostream *)&std::cout,&canvas);
  std::endl<char,std::char_traits<char>>(poVar13);
  std::_Vector_base<plot::GenericPoint<long>,_std::allocator<plot::GenericPoint<long>_>_>::
  ~_Vector_base(&points.
                 super__Vector_base<plot::GenericPoint<long>,_std::allocator<plot::GenericPoint<long>_>_>
               );
  plot::BrailleCanvas::~BrailleCanvas(&canvas);
  return 0;
}

Assistant:

int main() {
    // Each Braille Canvas is made up of cells that are 2x4 points
    // Points are switched on and off individually, but color is stored
    // per cell.
    constexpr Coord canvasCellCols = 70;
    constexpr Coord canvasCellRows = 20;
    constexpr Size canvasCellSize(canvasCellCols, canvasCellRows);

    BrailleCanvas canvas(canvasCellSize, TerminalInfo().detect());
    // The grid of the canvas is 70*2 x 20*4 or 140x80 points
    // so all future coordinates for where to draw objects are
    // relative to the 140x80 points with the origin (i.e. Point{0,0}) in the upper
    // left hand corner.

    // First draw a rectangle with a 'firebrick' outline and 'blueviolet' filling from point
    // location 11,11 to 40,40
    constexpr Point upperLeft(11, 11);
    constexpr Point lowerRight(40, 40);
    constexpr Rect filledRectangle(upperLeft, lowerRight);
    canvas.rect(palette::firebrick, palette::blueviolet, filledRectangle);

    // Draw lines in 'limegreen' overlayed onto the canvas
    // note that each method returns a reference to the object so
    // that commands can be easily chained together.

    // Push the current image to a stack and create a new clean image
    canvas.push()
          .line(palette::limegreen, { 12, 17 }, { 17, 39 })
          .line(palette::limegreen, { 17, 39 }, { 39, 34 })
          .line(palette::limegreen, { 39, 34 }, { 34, 12 })
          .line(palette::limegreen, { 34, 12 }, { 12, 17 });

    // Pop the previous image from the stack and composite the current
    // one onto it
    //
    // Most drawing commands can take an optional compositing operation
    // as their last argument. Three operations are available:
    //   - TerminalOp::Over = Paint source over destination, mix cell colors
    //   - TerminalOp::ClipDst = Erase destination cell where source is not empty
    //   - TerminalOp::ClipSrc = Ignore source cell where destination is not empty
    canvas.pop(TerminalOp::ClipDst);

    // Draw an ellipse in a bounding box from {0,0} to {30,30} offset by {45,11}
    constexpr Rect greyEllipseBoundingBox = Rect({ 30, 30 }) + Point(45, 11);
    canvas.ellipse(palette::slategrey, greyEllipseBoundingBox);
    // Draw an elipse with green outline, filled with yellow centered at {60,26} with  semi-axes of {10,12}
    canvas.ellipse(palette::green, palette::yellow, { 60, 26 }, { 10, 12 });

    // Bounding box for where the stroke functions are rendered.
    constexpr Coord xStart = 12;
    constexpr Coord xStop  = 71;
    constexpr Coord yStart = 46;
    constexpr Coord yStop  = 71;
    constexpr Rect strokeArea({ xStart, yStart }, { xStop, yStop });
    canvas.rect(palette::lightcyan, strokeArea);

    canvas.push();

    // Stroke a custom shaped line in 'royalblue' color
    //
    // The function 'sinStrokeFunction' will be evaluated at each value in [xStart, xStop]
    // and stroke in the color of 'royalblue' will be rendered for those coordinates.
    // Output will be clipped to range [yStart, yStop].
    canvas.stroke(palette::royalblue, strokeArea, sinStrokeFunction);

    constexpr float amplitude = 10;
    constexpr Coord vCenter = (yStop + yStart) / 2;

    // Fill cosine area using a custom lambda function returning true for
    // points inside the colored area.
    canvas.fill(palette::salmon, strokeArea, [](Point p) {
        Coord value = vCenter - std::lround(amplitude*std::cos(2*3.141592f*((p.x - xStart)/30.0f)));

        if (value < vCenter)
            return p.y <= vCenter && p.y >= value;
        else
            return p.y >= vCenter && p.y <= value;
     }, TerminalOp::ClipSrc);
     canvas.pop(TerminalOp::Over);

    // Place a dot in each corner of the pixel grid
    canvas.dot(palette::orange, { 0, 0 });
    canvas.dot(palette::purple, { 0, canvas.size().y - 1 });
    canvas.dot(palette::gold,   { canvas.size().x - 1, 0 });
    canvas.dot(palette::indigo, canvas.size() - Point(1, 1));

    // Draw a chain of lines from a sequence of points (initializer list)
    canvas.path(palette::deepskyblue, {
        { 98, 30 },
        { 80, 12 },
        { 100, 15 },
        { 82, 25 }
    });

    std::vector<Point> points{
        { 98, 50 },
        { 80, 68 },
        { 100, 65 },
        { 82, 55 }
    };

    // Draw a chain of lines from a sequence of points (iterators)
    canvas.path(palette::mediumseagreen, points.begin(), points.end());

    // Write the canvas to stdout
    std::cout << canvas << std::endl;

    return 0;
}